

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool tinyexr::DecompressRle
               (uchar *dst,unsigned_long uncompressed_size,uchar *src,unsigned_long src_size)

{
  int iVar1;
  allocator_type *paVar2;
  reference pvVar3;
  ulong in_RCX;
  void *in_RDX;
  value_type *pvVar4;
  ulong in_RSI;
  value_type *in_RDI;
  char *stop_1;
  char *s;
  char *t2;
  char *t1;
  int d;
  uchar *stop;
  uchar *t;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmpBuf;
  size_type in_stack_ffffffffffffff18;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  allocator_type *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  value_type *local_90;
  reference local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_80;
  allocator_type *local_68;
  int local_28;
  bool local_1;
  
  if (in_RSI == in_RCX) {
    memcpy(in_RDI,in_RDX,in_RCX);
    local_1 = true;
  }
  else if (in_RCX < 3) {
    local_1 = false;
  }
  else {
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x46ce8a);
    local_28 = (int)in_RCX;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
               in_stack_ffffffffffffff30);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x46ceb0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    iVar1 = rleUncompress(local_28,in_stack_ffffffffffffff3c,(char *)in_stack_ffffffffffffff30,
                          in_stack_ffffffffffffff28);
    if (iVar1 == (int)in_RSI) {
      paVar2 = (allocator_type *)
               std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      in_stack_ffffffffffffff30 = paVar2;
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      while (local_68 = paVar2 + 1, local_68 < (allocator_type *)(pvVar3 + in_RSI)) {
        *local_68 = (allocator_type)((char)*paVar2 + (char)*local_68 + 0x80);
        paVar2 = local_68;
      }
      local_80 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                           (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         (local_80,in_stack_ffffffffffffff18);
      local_90 = in_RDI;
      local_88 = pvVar3 + (in_RSI + 1 >> 1);
      while (local_90 < in_RDI + in_RSI) {
        pvVar4 = local_90 + 1;
        *local_90 = *(value_type *)
                     &(local_80->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start;
        if (in_RDI + in_RSI <= pvVar4) break;
        local_90 = local_90 + 2;
        *pvVar4 = *local_88;
        local_88 = local_88 + 1;
        local_80 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   ((long)&(local_80->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start + 1);
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff30);
  }
  return local_1;
}

Assistant:

static bool DecompressRle(unsigned char *dst,
                          const unsigned long uncompressed_size,
                          const unsigned char *src, unsigned long src_size) {
  if (uncompressed_size == src_size) {
    // Data is not compressed(Issue 40).
    memcpy(dst, src, src_size);
    return true;
  }

  // Workaround for issue #112.
  // TODO(syoyo): Add more robust out-of-bounds check in `rleUncompress`.
  if (src_size <= 2) {
    return false;
  }

  std::vector<unsigned char> tmpBuf(uncompressed_size);

  int ret = rleUncompress(static_cast<int>(src_size),
                          static_cast<int>(uncompressed_size),
                          reinterpret_cast<const signed char *>(src),
                          reinterpret_cast<char *>(&tmpBuf.at(0)));
  if (ret != static_cast<int>(uncompressed_size)) {
    return false;
  }

  //
  // Apply EXR-specific? postprocess. Grabbed from OpenEXR's
  // ImfRleCompressor.cpp
  //

  // Predictor.
  {
    unsigned char *t = &tmpBuf.at(0) + 1;
    unsigned char *stop = &tmpBuf.at(0) + uncompressed_size;

    while (t < stop) {
      int d = int(t[-1]) + int(t[0]) - 128;
      t[0] = static_cast<unsigned char>(d);
      ++t;
    }
  }

  // Reorder the pixel data.
  {
    const char *t1 = reinterpret_cast<const char *>(&tmpBuf.at(0));
    const char *t2 = reinterpret_cast<const char *>(&tmpBuf.at(0)) +
                     (uncompressed_size + 1) / 2;
    char *s = reinterpret_cast<char *>(dst);
    char *stop = s + uncompressed_size;

    for (;;) {
      if (s < stop)
        *(s++) = *(t1++);
      else
        break;

      if (s < stop)
        *(s++) = *(t2++);
      else
        break;
    }
  }

  return true;
}